

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  time_t tVar1;
  fnode_service_t *svc;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  char data [256];
  char acStack_138 [264];
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  if (argc < 2) {
    main_cold_2();
  }
  else {
    svc = fnode_service_create(argv[1],"TADC");
    if (svc != (fnode_service_t *)0x0) {
      fnode_service_reg_handler(svc,handler);
      uVar4 = 0;
      lVar3 = 0;
      do {
        do {
          fnode_service_update(svc);
          tVar1 = time((time_t *)0x0);
        } while (tVar1 - lVar3 < 2);
        dVar5 = sin((double)((float)uVar4 * 0.1));
        snprintf(acStack_138,0x100,"%d%d",0,(ulong)(uint)(int)(dVar5 * 30.0));
        sVar2 = strlen(acStack_138);
        fnode_service_notify_state(svc,acStack_138,(uint32_t)sVar2);
        uVar4 = uVar4 + 1;
        lVar3 = tVar1;
      } while( true );
    }
    main_cold_1();
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv)
{
    srand(time(0));

    if (argc < 2)
    {
        fprintf(stderr, "Usage: test-cocl SERIAL-NUMBER\n");
        return -1;
    }

    fnode_service_t * service = fnode_service_create(argv[1], "TADC");
    if ( !service )
    {
        fprintf(stderr, "Failed to create COCL service\n");
        return -1;
    }

    fnode_service_reg_handler(service, handler);

    time_t last_time = 0;
    size_t i = 0;

    for(;;)
    {
        fnode_service_update(service);

        time_t time_now = time(0);
        if (time_now - last_time > 1)
        {
            char data[256];
            snprintf(data, sizeof data, "%d%d",
                    0,
                    (int)(30 * sin(i * 0.1f)));
            fnode_service_notify_state(service, data, strlen(data));
            last_time = time_now;
            ++i;
        }
    }

    fnode_service_release(service);
    return 0;
}